

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O1

SVInt __thiscall slang::SVInt::xnor(SVInt *this,SVInt *rhs)

{
  ulong *puVar1;
  bool bVar2;
  uint64_t *puVar3;
  uint uVar4;
  byte bVar5;
  uint uVar6;
  SVInt *pSVar7;
  ulong *in_RDX;
  ulong uVar8;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  ulong uVar10;
  SVInt SVar11;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_28;
  uint local_20;
  byte local_1b;
  undefined8 uVar9;
  
  uVar4 = (rhs->super_SVIntStorage).bitWidth;
  if (uVar4 != (uint)in_RDX[1]) {
    bVar5 = *(byte *)((long)in_RDX + 0xc) & (rhs->super_SVIntStorage).signFlag;
    if (uVar4 < (uint)in_RDX[1]) {
      if (bVar5 == 0) {
        zext((SVInt *)&local_28,(bitwidth_t)rhs);
      }
      else {
        sext((SVInt *)&local_28,(bitwidth_t)rhs);
      }
      SVar11 = xnor(this,(SVInt *)&local_28);
      uVar9 = SVar11.super_SVIntStorage._8_8_;
    }
    else {
      if (bVar5 == 0) {
        zext((SVInt *)&local_28,(bitwidth_t)in_RDX);
      }
      else {
        sext((SVInt *)&local_28,(bitwidth_t)in_RDX);
      }
      SVar11 = xnor(this,rhs);
      uVar9 = SVar11.super_SVIntStorage._8_8_;
    }
    if (((0x40 < local_20) || ((local_1b & 1) != 0)) && ((void *)local_28.val != (void *)0x0)) {
      operator_delete__(local_28.pVal);
      uVar9 = extraout_RDX_00;
    }
    goto LAB_001ffacd;
  }
  SVInt(this,&rhs->super_SVIntStorage);
  if (((rhs->super_SVIntStorage).unknownFlag == false) && (*(char *)((long)in_RDX + 0xd) == '\x01'))
  {
    makeUnknown(this);
  }
  bVar2 = (this->super_SVIntStorage).unknownFlag;
  if ((this->super_SVIntStorage).bitWidth < 0x41 && (bVar2 & 1U) == 0) {
    uVar10 = (this->super_SVIntStorage).field_0.val ^ *in_RDX;
    pSVar7 = this;
LAB_001ffa79:
    (pSVar7->super_SVIntStorage).field_0.val = ~uVar10;
  }
  else {
    uVar6 = (rhs->super_SVIntStorage).bitWidth + 0x3f;
    uVar4 = uVar6 >> 6;
    if ((bVar2 & 1U) == 0) {
      if (0x3f < uVar6) {
        uVar10 = 0;
        do {
          puVar3 = (this->super_SVIntStorage).field_0.pVal;
          puVar3[uVar10] = ~(puVar3[uVar10] ^ *(ulong *)(*in_RDX + uVar10 * 8));
          uVar10 = uVar10 + 1;
        } while (uVar4 != uVar10);
      }
    }
    else {
      if ((uint)in_RDX[1] < 0x41 && (*(byte *)((long)in_RDX + 0xd) & 1) == 0) {
        pSVar7 = (SVInt *)(this->super_SVIntStorage).field_0.val;
        uVar10._0_4_ = (pSVar7->super_SVIntStorage).bitWidth;
        uVar10._4_1_ = (pSVar7->super_SVIntStorage).signFlag;
        uVar10._5_1_ = (pSVar7->super_SVIntStorage).unknownFlag;
        uVar10._6_2_ = *(undefined2 *)&(pSVar7->super_SVIntStorage).field_0xe;
        uVar10 = *in_RDX ^ (pSVar7->super_SVIntStorage).field_0.val | uVar10;
        goto LAB_001ffa79;
      }
      if ((*(byte *)((long)in_RDX + 0xd) & 0x3f < uVar6) == 1) {
        uVar8 = (ulong)uVar4;
        uVar10 = uVar8;
        do {
          puVar1 = (this->super_SVIntStorage).field_0.pVal + uVar10;
          *puVar1 = *puVar1 | *(ulong *)(*in_RDX + uVar10 * 8);
          uVar10 = uVar10 + 1;
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
      }
      if (0x3f < uVar6) {
        uVar10 = 0;
        do {
          puVar3 = (this->super_SVIntStorage).field_0.pVal;
          *(ulong *)((long)puVar3 + uVar10) =
               ~(*(ulong *)(*in_RDX + uVar10) ^ *(ulong *)((long)puVar3 + uVar10) |
                *(ulong *)((long)puVar3 + (uVar4 << 3) + uVar10));
          uVar10 = uVar10 + 8;
        } while (uVar4 << 3 != uVar10);
      }
    }
  }
  clearUnusedBits(this);
  uVar9 = extraout_RDX;
LAB_001ffacd:
  SVar11.super_SVIntStorage.bitWidth = (int)uVar9;
  SVar11.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar9 >> 0x20);
  SVar11.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar9 >> 0x28);
  SVar11.super_SVIntStorage._14_2_ = (short)((ulong)uVar9 >> 0x30);
  SVar11.super_SVIntStorage.field_0.pVal = (uint64_t *)this;
  return (SVInt)SVar11.super_SVIntStorage;
}

Assistant:

SVInt SVInt::xnor(const SVInt& rhs) const {
    if (bitWidth != rhs.bitWidth) {
        bool bothSigned = signFlag && rhs.signFlag;
        if (bitWidth < rhs.bitWidth)
            return extend(rhs.bitWidth, bothSigned).xnor(rhs);
        else
            return xnor(rhs.extend(bitWidth, bothSigned));
    }

    SVInt result(*this);
    if (!hasUnknown() && rhs.hasUnknown())
        result.makeUnknown();

    if (result.isSingleWord())
        result.val = ~(result.val ^ rhs.val);
    else {
        uint32_t words = getNumWords(bitWidth, false);
        if (result.hasUnknown()) {
            if (rhs.isSingleWord())
                result.pVal[0] = ~result.pVal[1] & ~(result.pVal[0] ^ rhs.val);
            else {
                if (rhs.hasUnknown()) {
                    for (uint32_t i = 0; i < words; i++)
                        result.pVal[i + words] |= rhs.pVal[i + words];
                }

                for (uint32_t i = 0; i < words; i++)
                    result.pVal[i] = ~result.pVal[i + words] & ~(result.pVal[i] ^ rhs.pVal[i]);
            }
        }
        else {
            for (uint32_t i = 0; i < words; i++)
                result.pVal[i] = ~(result.pVal[i] ^ rhs.pVal[i]);
        }
    }
    result.clearUnusedBits();
    return result;
}